

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char **__argv;
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char **__envp;
  undefined8 *in_RDI;
  bool bVar6;
  char *original_dir;
  int gtest_retval;
  ExecDeathTestArgs *args;
  String *in_stack_ffffffffffffff30;
  String *this;
  String *in_stack_ffffffffffffff40;
  String *this_00;
  String local_88;
  char local_78 [16];
  String local_68;
  char local_58 [16];
  char *local_48;
  char local_30 [20];
  int local_1c;
  undefined8 *local_18;
  
  local_18 = in_RDI;
  do {
    do {
      local_1c = close(*(int *)(local_18 + 1));
      bVar6 = false;
      if (local_1c == -1) {
        piVar4 = __errno_location();
        bVar6 = *piVar4 == 4;
      }
    } while (bVar6);
    if (local_1c == -1) {
      String::Format(local_30,"CHECK failed: File %s, line %d: %s != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhjphp[P]simhash/external/cppjieba/deps/gtest/./src/gtest-death-test.cc"
                     ,0x386,"close(args->close_fd)");
      DeathTestAbort(in_stack_ffffffffffffff40);
      String::~String(in_stack_ffffffffffffff30);
    }
    bVar6 = AlwaysFalse();
  } while (bVar6);
  UnitTest::GetInstance();
  local_48 = UnitTest::original_working_dir((UnitTest *)0x1fb064);
  iVar3 = chdir(local_48);
  pcVar2 = local_48;
  if (iVar3 == 0) {
    __argv = (char **)*local_18;
    this = (String *)*__argv;
    __envp = GetEnviron();
    execve((char *)this,__argv,__envp);
    pcVar2 = local_48;
    uVar1 = *(undefined8 *)*local_18;
    this_00 = &local_88;
    GetLastErrnoDescription();
    pcVar5 = String::c_str(this_00);
    String::Format(local_78,"execve(%s, ...) in %s failed: %s",uVar1,pcVar2,pcVar5);
    DeathTestAbort(this_00);
    String::~String(this);
    String::~String(this);
  }
  else {
    GetLastErrnoDescription();
    pcVar5 = String::c_str(&local_68);
    String::Format(local_58,"chdir(\"%s\") failed: %s",pcVar2,pcVar5);
    DeathTestAbort(in_stack_ffffffffffffff40);
    String::~String(in_stack_ffffffffffffff30);
    String::~String(in_stack_ffffffffffffff30);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(String::Format("chdir(\"%s\") failed: %s",
                                  original_dir,
                                  GetLastErrnoDescription().c_str()));
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(String::Format("execve(%s, ...) in %s failed: %s",
                                args->argv[0],
                                original_dir,
                                GetLastErrnoDescription().c_str()));
  return EXIT_FAILURE;
}